

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_const_impl.h
# Opt level: O2

void secp256k1_ecmult_const(secp256k1_gej *r,secp256k1_ge *a,secp256k1_scalar *scalar,int size)

{
  uint uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  secp256k1_fe *r_00;
  long lVar5;
  uint uVar6;
  uint uVar7;
  uint64_t *puVar8;
  secp256k1_fe *psVar9;
  secp256k1_gej *in_R8;
  int iVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  byte bVar15;
  int local_860;
  int local_85c;
  ulong local_848;
  secp256k1_ge tmpa;
  secp256k1_gej tmpj;
  secp256k1_fe Z;
  secp256k1_scalar q_lam;
  secp256k1_scalar q_1;
  int wnaf_1 [33];
  int wnaf_lam [33];
  secp256k1_ge pre_a [8];
  secp256k1_ge pre_a_lam [8];
  
  bVar15 = 0;
  if (size < 0x81) {
    local_85c = secp256k1_wnaf_const(wnaf_1,scalar,size,size);
    uVar12 = (ulong)(size + 3U >> 2);
    local_860 = 0;
  }
  else {
    iVar10 = size;
    secp256k1_scalar_split_lambda(&q_1,&q_lam,scalar);
    local_85c = secp256k1_wnaf_const(wnaf_1,&q_1,0x80,iVar10);
    local_860 = secp256k1_wnaf_const(wnaf_lam,&q_lam,0x80,iVar10);
    uVar12 = 0x20;
  }
  r->infinity = a->infinity;
  uVar2 = (a->x).n[1];
  uVar3 = (a->x).n[2];
  uVar4 = (a->x).n[3];
  (r->x).n[0] = (a->x).n[0];
  (r->x).n[1] = uVar2;
  (r->x).n[2] = uVar3;
  (r->x).n[3] = uVar4;
  (r->x).n[4] = (a->x).n[4];
  uVar2 = (a->y).n[1];
  uVar3 = (a->y).n[2];
  uVar4 = (a->y).n[3];
  (r->y).n[0] = (a->y).n[0];
  (r->y).n[1] = uVar2;
  (r->y).n[2] = uVar3;
  (r->y).n[3] = uVar4;
  (r->y).n[4] = (a->y).n[4];
  (r->z).n[0] = 1;
  (r->z).n[1] = 0;
  (r->z).n[2] = 0;
  (r->z).n[3] = 0;
  (r->z).n[4] = 0;
  secp256k1_ecmult_odd_multiples_table((int)pre_a,pre_a_lam,&Z,&r->x,in_R8);
  secp256k1_ge_table_set_globalz(8,pre_a,&pre_a_lam[0].x);
  for (lVar11 = 0x28; lVar11 != 0x2e8; lVar11 = lVar11 + 0x58) {
    secp256k1_fe_normalize_weak((secp256k1_fe *)((long)pre_a[0].x.n + lVar11));
  }
  if (0x80 < size) {
    for (lVar11 = 0; lVar11 != 0x2c0; lVar11 = lVar11 + 0x58) {
      r_00 = (secp256k1_fe *)((long)pre_a_lam[0].x.n + lVar11);
      puVar8 = (uint64_t *)((long)pre_a[0].x.n + lVar11);
      psVar9 = r_00;
      for (lVar5 = 0xb; lVar5 != 0; lVar5 = lVar5 + -1) {
        psVar9->n[0] = *puVar8;
        puVar8 = puVar8 + (ulong)bVar15 * -2 + 1;
        psVar9 = (secp256k1_fe *)((long)psVar9 + ((ulong)bVar15 * -2 + 1) * 8);
      }
      secp256k1_fe_mul(r_00,r_00,&secp256k1_const_beta);
    }
  }
  uVar1 = wnaf_1[uVar12];
  tmpa.x.n[0] = pre_a[0].x.n[0];
  tmpa.x.n[1] = pre_a[0].x.n[1];
  tmpa.x.n[2] = pre_a[0].x.n[2];
  tmpa.x.n[3] = pre_a[0].x.n[3];
  tmpa.x.n[4] = pre_a[0].x.n[4];
  tmpa.y.n[0] = pre_a[0].y.n[0];
  tmpa.y.n[1] = pre_a[0].y.n[1];
  tmpa.y.n[2] = pre_a[0].y.n[2];
  tmpa.y.n[3] = pre_a[0].y.n[3];
  tmpa.y.n[4] = pre_a[0].y.n[4];
  uVar7 = -uVar1;
  if (uVar1 != uVar7 && SBORROW4(uVar1,uVar7) == (int)(uVar1 * 2) < 0) {
    uVar7 = uVar1;
  }
  psVar9 = &pre_a[1].y;
  for (uVar13 = 1; uVar13 != 8; uVar13 = uVar13 + 1) {
    uVar6 = (uint)(uVar7 >> 1 == uVar13);
    secp256k1_fe_cmov(&tmpa.x,(secp256k1_fe *)(psVar9 + -1),uVar6);
    secp256k1_fe_cmov(&tmpa.y,psVar9,uVar6);
    psVar9 = (secp256k1_fe *)((long)(psVar9 + 2) + 8);
  }
  tmpa.infinity = 0;
  tmpj.x.n[0] = 0x3ffffbfffff0bc - tmpa.y.n[0];
  tmpj.x.n[1] = 0x3ffffffffffffc - tmpa.y.n[1];
  tmpj.x.n[2] = 0x3ffffffffffffc - tmpa.y.n[2];
  tmpj.x.n[3] = 0x3ffffffffffffc - tmpa.y.n[3];
  tmpj.x.n[4] = 0x3fffffffffffc - tmpa.y.n[4];
  secp256k1_fe_cmov(&tmpa.y,&tmpj.x,uVar1 >> 0x1f);
  r->infinity = tmpa.infinity;
  (r->x).n[4] = tmpa.x.n[4];
  (r->x).n[2] = tmpa.x.n[2];
  (r->x).n[3] = tmpa.x.n[3];
  (r->x).n[0] = tmpa.x.n[0];
  (r->x).n[1] = tmpa.x.n[1];
  (r->y).n[2] = tmpa.y.n[2];
  (r->y).n[3] = tmpa.y.n[3];
  (r->y).n[4] = tmpa.y.n[4];
  (r->y).n[0] = tmpa.y.n[0];
  (r->y).n[1] = tmpa.y.n[1];
  (r->z).n[0] = 1;
  (r->z).n[3] = 0;
  (r->z).n[4] = 0;
  (r->z).n[1] = 0;
  (r->z).n[2] = 0;
  if (0x80 < size) {
    uVar1 = wnaf_lam[uVar12];
    psVar9 = &pre_a_lam[1].y;
    tmpa.x.n[0] = pre_a_lam[0].x.n[0];
    tmpa.x.n[1] = pre_a_lam[0].x.n[1];
    tmpa.x.n[2] = pre_a_lam[0].x.n[2];
    tmpa.x.n[3] = pre_a_lam[0].x.n[3];
    tmpa.x.n[4] = pre_a_lam[0].x.n[4];
    tmpa.y.n[4] = pre_a_lam[0].y.n[4];
    tmpa.y.n[2] = pre_a_lam[0].y.n[2];
    tmpa.y.n[3] = pre_a_lam[0].y.n[3];
    tmpa.y.n[0] = pre_a_lam[0].y.n[0];
    tmpa.y.n[1] = pre_a_lam[0].y.n[1];
    uVar7 = -uVar1;
    if (uVar1 != uVar7 && SBORROW4(uVar1,uVar7) == (int)(uVar1 * 2) < 0) {
      uVar7 = uVar1;
    }
    for (uVar13 = 1; uVar13 != 8; uVar13 = uVar13 + 1) {
      uVar6 = (uint)(uVar7 >> 1 == uVar13);
      secp256k1_fe_cmov(&tmpa.x,(secp256k1_fe *)(psVar9 + -1),uVar6);
      secp256k1_fe_cmov(&tmpa.y,psVar9,uVar6);
      psVar9 = (secp256k1_fe *)((long)(psVar9 + 2) + 8);
    }
    tmpa.infinity = 0;
    tmpj.x.n[0] = 0x3ffffbfffff0bc - tmpa.y.n[0];
    tmpj.x.n[1] = 0x3ffffffffffffc - tmpa.y.n[1];
    tmpj.x.n[2] = 0x3ffffffffffffc - tmpa.y.n[2];
    tmpj.x.n[3] = 0x3ffffffffffffc - tmpa.y.n[3];
    tmpj.x.n[4] = 0x3fffffffffffc - tmpa.y.n[4];
    secp256k1_fe_cmov(&tmpa.y,&tmpj.x,uVar1 >> 0x1f);
    secp256k1_gej_add_ge(r,r,&tmpa);
  }
  while (local_848 = uVar12, 0 < (long)local_848) {
    iVar10 = 4;
    while (bVar14 = iVar10 != 0, iVar10 = iVar10 + -1, bVar14) {
      secp256k1_gej_double(r,r);
    }
    uVar1 = wnaf_1[local_848 - 1];
    tmpa.x.n[4] = pre_a[0].x.n[4];
    tmpa.x.n[2] = pre_a[0].x.n[2];
    tmpa.x.n[3] = pre_a[0].x.n[3];
    tmpa.x.n[0] = pre_a[0].x.n[0];
    tmpa.x.n[1] = pre_a[0].x.n[1];
    tmpa.y.n[0] = pre_a[0].y.n[0];
    tmpa.y.n[1] = pre_a[0].y.n[1];
    tmpa.y.n[4] = pre_a[0].y.n[4];
    uVar7 = -uVar1;
    if (uVar1 != uVar7 && SBORROW4(uVar1,uVar7) == (int)(uVar1 * 2) < 0) {
      uVar7 = uVar1;
    }
    tmpa.y.n[2] = pre_a[0].y.n[2];
    tmpa.y.n[3] = pre_a[0].y.n[3];
    psVar9 = &pre_a[1].y;
    for (uVar12 = 1; uVar12 != 8; uVar12 = uVar12 + 1) {
      uVar6 = (uint)(uVar7 >> 1 == uVar12);
      secp256k1_fe_cmov(&tmpa.x,(secp256k1_fe *)(psVar9 + -1),uVar6);
      secp256k1_fe_cmov(&tmpa.y,psVar9,uVar6);
      psVar9 = (secp256k1_fe *)((long)(psVar9 + 2) + 8);
    }
    tmpa.infinity = 0;
    tmpj.x.n[0] = 0x3ffffbfffff0bc - tmpa.y.n[0];
    tmpj.x.n[1] = 0x3ffffffffffffc - tmpa.y.n[1];
    tmpj.x.n[2] = 0x3ffffffffffffc - tmpa.y.n[2];
    tmpj.x.n[3] = 0x3ffffffffffffc - tmpa.y.n[3];
    tmpj.x.n[4] = 0x3fffffffffffc - tmpa.y.n[4];
    secp256k1_fe_cmov(&tmpa.y,&tmpj.x,uVar1 >> 0x1f);
    secp256k1_gej_add_ge(r,r,&tmpa);
    uVar12 = local_848 - 1;
    if (0x80 < size) {
      uVar1 = wnaf_lam[local_848 - 1];
      tmpa.x.n[4] = pre_a_lam[0].x.n[4];
      tmpa.x.n[2] = pre_a_lam[0].x.n[2];
      tmpa.x.n[3] = pre_a_lam[0].x.n[3];
      tmpa.x.n[0] = pre_a_lam[0].x.n[0];
      tmpa.x.n[1] = pre_a_lam[0].x.n[1];
      tmpa.y.n[0] = pre_a_lam[0].y.n[0];
      tmpa.y.n[1] = pre_a_lam[0].y.n[1];
      tmpa.y.n[4] = pre_a_lam[0].y.n[4];
      uVar7 = -uVar1;
      if (uVar1 != uVar7 && SBORROW4(uVar1,uVar7) == (int)(uVar1 * 2) < 0) {
        uVar7 = uVar1;
      }
      tmpa.y.n[2] = pre_a_lam[0].y.n[2];
      tmpa.y.n[3] = pre_a_lam[0].y.n[3];
      psVar9 = &pre_a_lam[1].y;
      for (uVar13 = 1; uVar13 != 8; uVar13 = uVar13 + 1) {
        uVar6 = (uint)(uVar7 >> 1 == uVar13);
        secp256k1_fe_cmov(&tmpa.x,(secp256k1_fe *)(psVar9 + -1),uVar6);
        secp256k1_fe_cmov(&tmpa.y,psVar9,uVar6);
        psVar9 = (secp256k1_fe *)((long)(psVar9 + 2) + 8);
      }
      tmpa.infinity = 0;
      tmpj.x.n[0] = 0x3ffffbfffff0bc - tmpa.y.n[0];
      tmpj.x.n[1] = 0x3ffffffffffffc - tmpa.y.n[1];
      tmpj.x.n[2] = 0x3ffffffffffffc - tmpa.y.n[2];
      tmpj.x.n[3] = 0x3ffffffffffffc - tmpa.y.n[3];
      tmpj.x.n[4] = 0x3fffffffffffc - tmpa.y.n[4];
      secp256k1_fe_cmov(&tmpa.y,&tmpj.x,uVar1 >> 0x1f);
      secp256k1_gej_add_ge(r,r,&tmpa);
    }
  }
  secp256k1_ge_neg(&tmpa,pre_a);
  secp256k1_gej_add_ge(&tmpj,r,&tmpa);
  secp256k1_gej_cmov(r,&tmpj,local_85c);
  if (0x80 < size) {
    secp256k1_ge_neg(&tmpa,pre_a_lam);
    secp256k1_gej_add_ge(&tmpj,r,&tmpa);
    secp256k1_gej_cmov(r,&tmpj,local_860);
  }
  secp256k1_fe_mul(&r->z,&r->z,&Z);
  return;
}

Assistant:

static void secp256k1_ecmult_const(secp256k1_gej *r, const secp256k1_ge *a, const secp256k1_scalar *scalar, int size) {
    secp256k1_ge pre_a[ECMULT_TABLE_SIZE(WINDOW_A)];
    secp256k1_ge tmpa;
    secp256k1_fe Z;

    int skew_1;
    secp256k1_ge pre_a_lam[ECMULT_TABLE_SIZE(WINDOW_A)];
    int wnaf_lam[1 + WNAF_SIZE(WINDOW_A - 1)];
    int skew_lam;
    secp256k1_scalar q_1, q_lam;
    int wnaf_1[1 + WNAF_SIZE(WINDOW_A - 1)];

    int i;

    /* build wnaf representation for q. */
    int rsize = size;
    if (size > 128) {
        rsize = 128;
        /* split q into q_1 and q_lam (where q = q_1 + q_lam*lambda, and q_1 and q_lam are ~128 bit) */
        secp256k1_scalar_split_lambda(&q_1, &q_lam, scalar);
        skew_1   = secp256k1_wnaf_const(wnaf_1,   &q_1,   WINDOW_A - 1, 128);
        skew_lam = secp256k1_wnaf_const(wnaf_lam, &q_lam, WINDOW_A - 1, 128);
    } else
    {
        skew_1   = secp256k1_wnaf_const(wnaf_1, scalar, WINDOW_A - 1, size);
        skew_lam = 0;
    }

    /* Calculate odd multiples of a.
     * All multiples are brought to the same Z 'denominator', which is stored
     * in Z. Due to secp256k1' isomorphism we can do all operations pretending
     * that the Z coordinate was 1, use affine addition formulae, and correct
     * the Z coordinate of the result once at the end.
     */
    VERIFY_CHECK(!a->infinity);
    secp256k1_gej_set_ge(r, a);
    secp256k1_ecmult_odd_multiples_table_globalz_windowa(pre_a, &Z, r);
    for (i = 0; i < ECMULT_TABLE_SIZE(WINDOW_A); i++) {
        secp256k1_fe_normalize_weak(&pre_a[i].y);
    }
    if (size > 128) {
        for (i = 0; i < ECMULT_TABLE_SIZE(WINDOW_A); i++) {
            secp256k1_ge_mul_lambda(&pre_a_lam[i], &pre_a[i]);
        }

    }

    /* first loop iteration (separated out so we can directly set r, rather
     * than having it start at infinity, get doubled several times, then have
     * its new value added to it) */
    i = wnaf_1[WNAF_SIZE_BITS(rsize, WINDOW_A - 1)];
    VERIFY_CHECK(i != 0);
    ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a, i, WINDOW_A);
    secp256k1_gej_set_ge(r, &tmpa);
    if (size > 128) {
        i = wnaf_lam[WNAF_SIZE_BITS(rsize, WINDOW_A - 1)];
        VERIFY_CHECK(i != 0);
        ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a_lam, i, WINDOW_A);
        secp256k1_gej_add_ge(r, r, &tmpa);
    }
    /* remaining loop iterations */
    for (i = WNAF_SIZE_BITS(rsize, WINDOW_A - 1) - 1; i >= 0; i--) {
        int n;
        int j;
        for (j = 0; j < WINDOW_A - 1; ++j) {
            secp256k1_gej_double(r, r);
        }

        n = wnaf_1[i];
        ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a, n, WINDOW_A);
        VERIFY_CHECK(n != 0);
        secp256k1_gej_add_ge(r, r, &tmpa);
        if (size > 128) {
            n = wnaf_lam[i];
            ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a_lam, n, WINDOW_A);
            VERIFY_CHECK(n != 0);
            secp256k1_gej_add_ge(r, r, &tmpa);
        }
    }

    {
        /* Correct for wNAF skew */
        secp256k1_gej tmpj;

        secp256k1_ge_neg(&tmpa, &pre_a[0]);
        secp256k1_gej_add_ge(&tmpj, r, &tmpa);
        secp256k1_gej_cmov(r, &tmpj, skew_1);

        if (size > 128) {
            secp256k1_ge_neg(&tmpa, &pre_a_lam[0]);
            secp256k1_gej_add_ge(&tmpj, r, &tmpa);
            secp256k1_gej_cmov(r, &tmpj, skew_lam);
        }
    }

    secp256k1_fe_mul(&r->z, &r->z, &Z);
}